

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

vector<float,_std::allocator<float>_> * __thiscall
wave::File::Read(vector<float,_std::allocator<float>_> *__return_storage_ptr__,File *this,
                error_code *err)

{
  _Head_base<0UL,_wave::File::Impl_*,_false> _Var1;
  Error err_00;
  error_code eVar2;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var1._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<wave::File::Impl,_std::default_delete<wave::File::Impl>_>._M_t.
       super__Tuple_impl<0UL,_wave::File::Impl_*,_std::default_delete<wave::File::Impl>_>.
       super__Head_base<0UL,_wave::File::Impl_*,_false>._M_head_impl;
  err_00 = Read(this,((ulong)*(uint32_t *)((long)&(_Var1._M_head_impl)->header + 0x28) /
                     (ulong)(*(uint16_t *)((long)&(_Var1._M_head_impl)->header + 0x22) >> 3)) /
                     (ulong)*(uint16_t *)((long)&(_Var1._M_head_impl)->header + 0x16),
                internal::NoDecrypt,__return_storage_ptr__);
  eVar2 = make_error_code(err_00);
  err->_M_value = eVar2._M_value;
  err->_M_cat = eVar2._M_cat;
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> File::Read(std::error_code& err) {
  std::vector<float> output;
  auto wave_error = Read(&output);
  err = make_error_code(wave_error);
  return output;
}